

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpRelation
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  _func_int **pp_Var1;
  AST AVar2;
  int iVar3;
  ExpressionAST *pEVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  _func_int **pp_Var8;
  ExpressionKind EVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  string R;
  string L;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_40;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_38;
  
  local_38._M_head_impl =
       (LHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  EVar9 = (local_38._M_head_impl)->Kind;
  if (EVar9 != StringExpression) {
    if (EVar9 == IntExpression) {
      pEVar4 = (RHS->_M_t).
               super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
               .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      if ((pEVar4->Kind == IntExpression) && (TokenKind - Less < 6)) {
        iVar5 = *(int *)&(local_38._M_head_impl)->field_0xc;
        iVar3 = *(int *)&pEVar4->field_0xc;
        switch(TokenKind) {
        case Less:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar5 < iVar3;
          break;
        case LessEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar5 <= iVar3;
          break;
        case EqualEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar5 == iVar3;
          break;
        case ExclaimEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar5 != iVar3;
          break;
        case Greater:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 < iVar5;
          break;
        case GreaterEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 <= iVar5;
        }
        goto LAB_0011527c;
      }
      goto LAB_00115099;
    }
LAB_00115039:
    if (EVar9 != DoubleExpression) goto LAB_00115099;
    pEVar4 = (RHS->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    if ((pEVar4->Kind != DoubleExpression) || (5 < TokenKind - Less)) goto LAB_001150de;
    pp_Var1 = local_38._M_head_impl[1].super_AST._vptr_AST;
    AVar2._vptr_AST = pEVar4[1].super_AST._vptr_AST;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)AVar2._vptr_AST < (double)pp_Var1;
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)AVar2._vptr_AST < (double)pp_Var1;
      goto LAB_00115267;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)pp_Var1 == (double)AVar2._vptr_AST;
      goto LAB_00115223;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)pp_Var1 != (double)AVar2._vptr_AST;
LAB_00115223:
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
      *(bool *)((long)pp_Var8 + 0xc) = bVar12;
      goto LAB_0011527c;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)pp_Var1 < (double)AVar2._vptr_AST;
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = (double)pp_Var1 < (double)AVar2._vptr_AST;
LAB_00115267:
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
      *(bool *)((long)pp_Var8 + 0xc) = !bVar12;
      goto LAB_0011527c;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
    *(bool *)((long)pp_Var8 + 0xc) = !bVar12 && (double)pp_Var1 != (double)AVar2._vptr_AST;
    goto LAB_0011527c;
  }
  if (((RHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl)->Kind == StringExpression) {
    local_60 = local_50;
    AVar2._vptr_AST = local_38._M_head_impl[1].super_AST._vptr_AST;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,AVar2._vptr_AST,
               *(long *)&local_38._M_head_impl[1].Kind + (long)AVar2._vptr_AST);
    pEVar4 = (RHS->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    local_80 = local_70;
    AVar2._vptr_AST = pEVar4[1].super_AST._vptr_AST;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,AVar2._vptr_AST,*(long *)&pEVar4[1].Kind + (long)AVar2._vptr_AST)
    ;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar7 = local_58;
      if (local_78 < local_58) {
        uVar7 = local_78;
      }
      if (uVar7 == 0) {
LAB_00114d21:
        uVar7 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_58 - local_78)) {
          uVar7 = local_58 - local_78;
        }
        if (0x7ffffffe < (long)uVar7) {
          uVar7 = 0;
        }
      }
      else {
        uVar6 = memcmp(local_60,local_80,uVar7);
        uVar7 = (ulong)uVar6;
        if (uVar6 == 0) goto LAB_00114d21;
      }
      bVar12 = (bool)((byte)(uVar7 >> 0x1f) & 1);
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar7 = local_58;
      if (local_78 < local_58) {
        uVar7 = local_78;
      }
      if (uVar7 == 0) {
LAB_00114e7b:
        uVar7 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_58 - local_78)) {
          uVar7 = local_58 - local_78;
        }
        if (0x7ffffffe < (long)uVar7) {
          uVar7 = 0x7fffffff;
        }
      }
      else {
        uVar6 = memcmp(local_60,local_80,uVar7);
        uVar7 = (ulong)uVar6;
        if (uVar6 == 0) goto LAB_00114e7b;
      }
      bVar12 = (int)uVar7 < 1;
      break;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      if (local_58 == local_78) {
        if (local_58 == 0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(local_60,local_80,local_58);
          bVar12 = iVar5 == 0;
        }
      }
      else {
LAB_00114fdf:
        bVar12 = false;
      }
      break;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = true;
      if (local_58 == local_78) {
        if (local_58 == 0) goto LAB_00114fdf;
        iVar5 = bcmp(local_60,local_80,local_58);
        bVar12 = iVar5 != 0;
      }
      break;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar7 = local_58;
      if (local_78 < local_58) {
        uVar7 = local_78;
      }
      if (uVar7 == 0) {
LAB_00114d8d:
        uVar7 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_58 - local_78)) {
          uVar7 = local_58 - local_78;
        }
        if (0x7ffffffe < (long)uVar7) {
          uVar7 = 0x7fffffff;
        }
      }
      else {
        uVar6 = memcmp(local_60,local_80,uVar7);
        uVar7 = (ulong)uVar6;
        if (uVar6 == 0) goto LAB_00114d8d;
      }
      bVar12 = 0 < (int)uVar7;
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar7 = local_58;
      if (local_78 < local_58) {
        uVar7 = local_78;
      }
      if (uVar7 == 0) {
LAB_00114ee9:
        uVar7 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_58 - local_78)) {
          uVar7 = local_58 - local_78;
        }
        if (0x7ffffffe < (long)uVar7) {
          uVar7 = 0x7fffffff;
        }
      }
      else {
        uVar6 = memcmp(local_60,local_80,uVar7);
        uVar7 = (ulong)uVar6;
        if (uVar6 == 0) goto LAB_00114ee9;
      }
      bVar12 = -1 < (int)uVar7;
      break;
    default:
      bVar12 = true;
      goto LAB_00115001;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
    *(bool *)((long)pp_Var8 + 0xc) = bVar12;
    (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
    bVar12 = false;
LAB_00115001:
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if (!bVar12) {
      return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
    }
    local_38._M_head_impl =
         (LHS->_M_t).
         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
         super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    EVar9 = (local_38._M_head_impl)->Kind;
    goto LAB_00115039;
  }
LAB_00115099:
  if (((EVar9 != BoolExpression) ||
      (pEVar4 = (RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
      pEVar4->Kind != BoolExpression)) || (5 < TokenKind - Less)) {
LAB_001150de:
    (LHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    local_40._M_head_impl =
         (RHS->_M_t).
         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
         super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (RHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    create(this,TokenKind,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_38,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_40);
    if (local_40._M_head_impl != (ExpressionAST *)0x0) {
      (*((local_40._M_head_impl)->super_AST)._vptr_AST[1])();
    }
    if (local_38._M_head_impl == (ExpressionAST *)0x0) {
      return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
    }
    (*((local_38._M_head_impl)->super_AST)._vptr_AST[1])();
    return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
  }
  bVar11 = (local_38._M_head_impl)->field_0xc;
  bVar10 = pEVar4->field_0xc;
  switch(TokenKind) {
  case Less:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 & (bVar11 ^ 1);
    break;
  case LessEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar11 = bVar11 ^ 1;
    goto LAB_00115198;
  case EqualEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar11 = bVar11 ^ bVar10 ^ 1;
    goto LAB_00115151;
  case ExclaimEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 ^ bVar11;
    break;
  case Greater:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar11 = bVar11 & ~bVar10;
LAB_00115151:
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
    *(byte *)((long)pp_Var8 + 0xc) = bVar11;
    goto LAB_0011527c;
  case GreaterEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 ^ 1;
LAB_00115198:
    bVar10 = bVar10 | bVar11;
  }
  *(undefined4 *)(pp_Var8 + 1) = 2;
  *pp_Var8 = (_func_int *)&PTR__AST_001238f0;
  *(byte *)((long)pp_Var8 + 0xc) = bVar10;
LAB_0011527c:
  (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpRelation(Token::TokenKind TokenKind,
                                        std::unique_ptr<ExpressionAST> LHS,
                                        std::unique_ptr<ExpressionAST> RHS) {

#define CASE(TOKEN_KIND, OPERATOR)                                             \
  case Token::TOKEN_KIND:                                                      \
    return std::unique_ptr<BoolAST>(new BoolAST(L OPERATOR R))

#define TRY_COMPARE(type, Type)                                                \
  do {                                                                         \
    if (LHS->is##Type() && RHS->is##Type()) {                                  \
      type L = LHS->as_cptr<Type##AST>()->getValue();                          \
      type R = RHS->as_cptr<Type##AST>()->getValue();                          \
      switch (TokenKind) {                                                     \
      default: break;                                                          \
      CASE(Less, <);                                                           \
      CASE(LessEqual, <=);                                                     \
      CASE(EqualEqual, ==);                                                    \
      CASE(ExclaimEqual, !=);                                                  \
      CASE(GreaterEqual, >=);                                                  \
      CASE(Greater, >);                                                        \
      }                                                                        \
    }                                                                          \
  } while (0)

  TRY_COMPARE(int, Int);
  TRY_COMPARE(std::string, String);
  TRY_COMPARE(double, Double);
  TRY_COMPARE(bool, Bool);

#undef TRY_COMPARE
#undef CASE

  // TODO: Not very elegant, but this is ok.
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}